

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cc
# Opt level: O1

string * OB::String::replace(string *__return_storage_ptr__,string *str,string *key,string *val)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  ulong uVar4;
  
  for (uVar4 = std::__cxx11::string::find((char *)str,(ulong)(key->_M_dataplus)._M_p,0);
      uVar4 != 0xffffffffffffffff;
      uVar4 = std::__cxx11::string::find
                        ((char *)str,(ulong)(key->_M_dataplus)._M_p,uVar4 + val->_M_string_length))
  {
    std::__cxx11::string::replace
              ((ulong)str,uVar4,(char *)key->_M_string_length,(ulong)(val->_M_dataplus)._M_p);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (str->_M_dataplus)._M_p;
  paVar1 = &str->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&str->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = str->_M_string_length;
  (str->_M_dataplus)._M_p = (pointer)paVar1;
  str->_M_string_length = 0;
  (str->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string replace(std::string str, std::string const& key, std::string const& val)
{
  std::size_t pos {0};

  for (;;)
  {
    pos = str.find(key, pos);

    if (pos == std::string::npos)
    {
      break;
    }

    str.replace(pos, key.size(), val);
    pos += val.size();
  }

  return str;
}